

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QTabBarPrivate::Tab_*>::relocate
          (QArrayDataPointer<QTabBarPrivate::Tab_*> *this,qsizetype offset,Tab ***data)

{
  Tab **d_first;
  Tab **ppTVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QTabBarPrivate::Tab*,long_long>(this->ptr,this->size,d_first);
  if (data != (Tab ***)0x0) {
    ppTVar1 = *data;
    if ((this->ptr <= ppTVar1) && (ppTVar1 < this->ptr + this->size)) {
      *data = ppTVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }